

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O1

void __thiscall NaConfigPart::SetInstance(NaConfigPart *this,char *szInstance)

{
  size_t sVar1;
  char *__dest;
  
  if (szInstance != (char *)0x0) {
    sVar1 = strlen(szInstance);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->szInstanceName = __dest;
    strcpy(__dest,szInstance);
    return;
  }
  if (this->szInstanceName != (char *)0x0) {
    operator_delete__(this->szInstanceName);
  }
  this->szInstanceName = (char *)0x0;
  return;
}

Assistant:

void
NaConfigPart::SetInstance (const char* szInstance)
{
    if(NULL == szInstance){
        delete[] szInstanceName;
        szInstanceName = NULL;
    }
    else{
        szInstanceName = new char[strlen(szInstance) + 1];
        strcpy(szInstanceName, szInstance);
    }
}